

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void spsel_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t val)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = arm_current_el(env);
  uVar1 = env->pstate;
  if (((uVar1 ^ (uint)val) & 1) != 0) {
    lVar3 = 0;
    if ((uVar1 & 1) != 0) {
      lVar3 = (long)iVar2;
    }
    env->sp_el[lVar3] = env->xregs[0x1f];
    env->pstate = uVar1 & 0xfffffffe | (uint)val & 1;
    if (2 < iVar2 - 1U) {
      __assert_fail("cur_el >= 1 && cur_el <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                    ,0xdd,"void update_spsel(CPUARMState *, uint32_t)");
    }
    lVar3 = (long)iVar2;
    if ((val & 1) == 0) {
      lVar3 = 0;
    }
    env->xregs[0x1f] = env->sp_el[lVar3];
  }
  return;
}

Assistant:

static void spsel_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t val)
{
    update_spsel(env, val);
}